

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O2

void __thiscall fancy_tools::fix_fences(fancy_tools *this,char *section)

{
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  xr_file_system *this_00;
  xr_memory_writer *this_01;
  long lVar4;
  string *psVar5;
  size_t sVar6;
  char cVar7;
  string *psVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  xr_reader *local_e0;
  uint chunk_id;
  xr_reader *local_d0;
  xr_memory_writer *local_c8;
  string lm;
  string base;
  string raw;
  string shader;
  
  this_00 = xray_re::xr_file_system::instance();
  local_d0 = xray_re::xr_file_system::r_open(this_00,"$level$","level");
  if (local_d0 != (xr_reader *)0x0) {
    this_01 = (xr_memory_writer *)operator_new(0x2078);
    xray_re::xr_memory_writer::xr_memory_writer(this_01);
    local_e0 = (xr_reader *)0x0;
    local_c8 = this_01;
    while( true ) {
      local_e0 = xray_re::xr_reader::open_chunk_next(local_d0,&chunk_id,local_e0);
      if (local_e0 == (xr_reader *)0x0) break;
      xray_re::xr_writer::open_chunk(&this_01->super_xr_writer,chunk_id);
      if (chunk_id == 2) {
        puVar2 = (local_e0->field_2).m_p_u32;
        (local_e0->field_2).m_p = (uint8_t *)(puVar2 + 1);
        uVar1 = *puVar2;
        uVar11 = (ulong)uVar1;
        raw._M_dataplus._M_p._0_4_ = uVar1;
        (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,&raw,4);
        while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
          raw._M_dataplus._M_p = (pointer)&raw.field_2;
          raw._M_string_length = 0;
          shader._M_dataplus._M_p = (pointer)&shader.field_2;
          shader._M_string_length = 0;
          base._M_dataplus._M_p = (pointer)&base.field_2;
          base._M_string_length = 0;
          raw.field_2._M_local_buf[0] = '\0';
          shader.field_2._M_local_buf[0] = '\0';
          base.field_2._M_local_buf[0] = '\0';
          lm._M_dataplus._M_p = (pointer)&lm.field_2;
          lm._M_string_length = 0;
          lm.field_2._M_local_buf[0] = '\0';
          xray_re::xr_reader::r_sz(local_e0,&raw);
          cVar7 = (char)&raw;
          lVar4 = std::__cxx11::string::find(cVar7,0x2f);
          if (lVar4 != -1) {
            std::__cxx11::string::assign((string *)&shader,(ulong)&raw,0);
            uVar10 = lVar4 + 1;
            lVar4 = std::__cxx11::string::find(cVar7,0x2c);
            if (lVar4 == -1) {
              psVar8 = &base;
            }
            else {
              std::__cxx11::string::assign((string *)&base,(ulong)&raw,uVar10);
              uVar10 = lVar4 + 1;
              psVar8 = &lm;
            }
            std::__cxx11::string::assign((string *)psVar8,(ulong)&raw,uVar10);
            lVar4 = std::__cxx11::string::find((char *)&shader,0x1c7140);
            if (lVar4 == -1) {
              bVar12 = xray_re::xr_ini_file::line_exist(this->m_ini,section,base._M_dataplus._M_p);
              if (bVar12) {
                pcVar9 = "";
                if (lm._M_string_length == 0) {
                  pcVar9 = "_v";
                }
                xray_re::msg("%s: %s -> %s%s",base._M_dataplus._M_p,shader._M_dataplus._M_p,
                             "def_shaders\\def_aref",pcVar9);
                std::__cxx11::string::assign((char *)&shader);
                if (lm._M_string_length == 0) {
                  std::__cxx11::string::append((char *)&shader);
                }
              }
            }
            std::__cxx11::string::_M_assign((string *)&raw);
            psVar5 = (string *)std::__cxx11::string::append((ulong)&raw,'\x01');
            std::__cxx11::string::append(psVar5);
            if (lm._M_string_length != 0) {
              psVar5 = (string *)std::__cxx11::string::append((ulong)&raw,'\x01');
              std::__cxx11::string::append(psVar5);
            }
          }
          xray_re::xr_writer::w_sz(&local_c8->super_xr_writer,&raw);
          std::__cxx11::string::~string((string *)&lm);
          std::__cxx11::string::~string((string *)&base);
          std::__cxx11::string::~string((string *)&shader);
          std::__cxx11::string::~string((string *)&raw);
        }
      }
      else {
        puVar3 = local_e0->m_data;
        sVar6 = xray_re::xr_reader::size(local_e0);
        (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,puVar3,sVar6);
      }
      this_01 = local_c8;
      xray_re::xr_writer::close_chunk(&local_c8->super_xr_writer);
    }
    (*local_d0->_vptr_xr_reader[1])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw,"level",(allocator<char> *)&shader);
    xray_re::xr_memory_writer::save_to(this_01,"$fancy_level$",&raw);
    std::__cxx11::string::~string((string *)&raw);
    (*(this_01->super_xr_writer)._vptr_xr_writer[1])(this_01);
    return;
  }
  xray_re::msg("can\'t load %s","level");
  return;
}

Assistant:

void fancy_tools::fix_fences(const char* section) const
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_LEVEL, "level");
	if (r == 0) {
		msg("can't load %s", "level");
		return;
	}

	xr_memory_writer* w = new xr_memory_writer();

	unsigned chunk_id;
	for (xr_reader* s = 0; (s = r->open_chunk_next(chunk_id, s)) != 0;) {
		w->open_chunk(chunk_id);
		if (chunk_id == FSL13_SHADERS) {
			size_t n = s->r_u32();
			w->w_size_u32(n);
			while (n--) {
				std::string raw, shader, base, lm;
				s->r_sz(raw);
				std::string::size_type slash = raw.find('/'), comma;
				if (slash == std::string::npos) {
					w->w_sz(raw);
					continue;
				}
				shader.assign(raw, 0, slash);
				comma = raw.find(',', ++slash);
				if (comma == std::string::npos) {
					base.assign(raw, slash, std::string::npos);
				} else {
					base.assign(raw, slash, comma - slash);
					lm.assign(raw, ++comma, std::string::npos);
				}
				if (shader.find("def_shaders\\def_aref") == std::string::npos &&
						m_ini->line_exist(section, base.c_str())) {
					msg("%s: %s -> %s%s", base.c_str(), shader.c_str(),
							"def_shaders\\def_aref", lm.empty() ? "_v" : "");
					shader = "def_shaders\\def_aref";
					if (lm.empty())
						shader += "_v";
				}
				raw.assign(shader).append(1, '/').append(base);
				if (!lm.empty())
					raw.append(1, ',').append(lm);
				w->w_sz(raw);
			}
		} else {
			w->w_raw(s->data(), s->size());
		}
		w->close_chunk();
	}
	fs.r_close(r);
	w->save_to(PA_FANCY_LEVEL, "level");
	delete w;
}